

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O2

void glu::drawFromBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  int *__k;
  uint uVar1;
  VertexComponentConversion VVar2;
  IndexType IVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  out;
  pointer pVVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  int iVar12;
  VertexAttributeDescriptor *__cur_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__n;
  iterator iVar13;
  pointer pVVar14;
  pointer pVVar15;
  pointer pVVar16;
  pointer pVVar17;
  ulong uVar18;
  pointer pVVar19;
  long lVar20;
  undefined4 extraout_var_01;
  TestError *pTVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  size_t __n_00;
  undefined8 *extraout_RDX;
  undefined8 *puVar25;
  size_t __n_01;
  int ndx;
  pointer pVVar26;
  int iVar27;
  VertexAttributeDescriptor *__cur;
  VertexComponentType VVar28;
  uint uVar29;
  long lVar30;
  Functions *gl;
  VertexArrayBinding *cur;
  _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  *this;
  pointer pVVar31;
  VertexArrayPointer *pVVar32;
  int iVar33;
  pointer __p;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  *in_stack_fffffffffffffe78;
  allocator_type local_169;
  pointer local_168;
  pointer local_160;
  uint local_158;
  vector<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  local_150;
  ulong local_138;
  pointer local_130;
  pointer local_128;
  pointer local_120;
  PrimitiveList *local_118;
  pointer local_110;
  ulong local_108;
  Functions *local_100;
  ulong local_f8;
  pointer local_f0;
  pointer local_e8;
  VertexBuffer vertexBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> localBuf;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_> srcPtrs;
  
  iVar9 = (*context->_vptr_RenderContext[3])();
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  out.iter._M_current = (VertexArrayBinding *)callback;
  out.container = in_stack_fffffffffffffe78;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)CONCAT44(extraout_var,iVar9),(Functions *)(ulong)program,
             (deUint32)vertexArrays,vertexArrays + numVertexArrays,
             (VertexArrayBinding *)&bindingsWithLocations,out);
  bVar8 = (anonymous_namespace)::
          areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                    ((__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                      )bindingsWithLocations.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                      )bindingsWithLocations.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (!bVar8) {
    pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar21,(char *)0x0,
               "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x21a);
    __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar14 = (pointer)0x0;
  if ((long)bindingsWithLocations.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)bindingsWithLocations.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    pVVar14 = bindingsWithLocations.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  local_108 = ((long)bindingsWithLocations.
                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)bindingsWithLocations.
                    super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&vertexBuffer.super_Buffer,context);
  vertexBuffer.m_layout.buffer = 0;
  vertexBuffer.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexBuffer.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexBuffer.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = primitives;
  local_110 = pVVar14;
  local_100 = (Functions *)CONCAT44(extraout_var,iVar9);
  iVar9 = (*context->_vptr_RenderContext[3])(context);
  lVar20 = CONCAT44(extraout_var_00,iVar9);
  local_158 = 0;
  local_150.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (char *)(long)(int)local_108;
  localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar30 = (long)__n * 0x50;
  local_e8 = local_110 + (long)__n;
  pVVar14 = local_110;
  while( true ) {
    if (lVar30 == 0) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &localBuf);
      pVVar14 = local_110;
      pVVar19 = local_150.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pVVar26 = local_150.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pVVar16 = local_150.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar31 = local_110;
      uVar23 = local_108;
      uVar29 = local_158;
      do {
        uVar22 = (ulong)uVar29;
        if (pVVar14 == local_e8) {
          local_158 = uVar29;
          local_150.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_start = pVVar16;
          local_150.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_finish = pVVar26;
          local_150.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar19;
          local_138 = uVar22;
          std::vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>::vector
                    (&srcPtrs,(size_type)__n,(allocator_type *)&localBuf);
          dVar11 = vertexBuffer.super_Buffer.super_ObjectWrapper.m_object;
          gl = local_100;
          local_168 = srcPtrs.
                      super__Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = 0;
          uVar22 = uVar23 & 0xffffffff;
          if ((int)uVar23 < 1) {
            uVar22 = uVar18;
          }
          pVVar32 = &pVVar31->pointer;
          for (; uVar22 * 0x20 != uVar18; uVar18 = uVar18 + 0x20) {
            uVar5 = *(undefined8 *)pVVar32;
            uVar6 = *(undefined8 *)&pVVar32->numComponents;
            pvVar4 = pVVar32->data;
            puVar25 = (undefined8 *)
                      ((long)&(srcPtrs.
                               super__Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->stride + uVar18);
            *puVar25 = *(undefined8 *)&pVVar32->stride;
            puVar25[1] = pvVar4;
            puVar25 = (undefined8 *)
                      ((long)&(srcPtrs.
                               super__Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->componentType + uVar18);
            *puVar25 = uVar5;
            puVar25[1] = uVar6;
            pVVar32 = (VertexArrayPointer *)((long)(pVVar32 + 2) + 0x10);
          }
          if (srcPtrs.
              super__Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              srcPtrs.
              super__Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            uVar23 = (long)pVVar26 - (long)pVVar16;
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&localBuf,(long)(int)local_138,&local_169);
            local_f8 = (long)pVVar26 - (long)pVVar16;
            local_f0 = (pointer)(long)(int)(local_f8 >> 5);
            pVVar14 = (pointer)0x0;
            local_130 = pVVar26;
            local_128 = pVVar16;
            if ((long)local_f0 < 1) {
              local_f0 = pVVar14;
            }
            while (pVVar16 = local_128, pVVar26 = local_130, pVVar7 = local_168, pVVar14 != local_f0
                  ) {
              local_160 = localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_120 = (pointer)(local_168 + (long)pVVar14);
              local_e8 = pVVar14;
              iVar10 = anon_unknown_4::getVtxCompSize(local_128[(long)pVVar14].componentType);
              iVar10 = iVar10 * pVVar16[(long)pVVar14].numComponents;
              iVar9 = pVVar7[(long)pVVar14].stride;
              iVar12 = pVVar16[(long)pVVar14].stride;
              if ((iVar9 == 0 || iVar9 == iVar10) && (iVar12 == 0 || iVar12 == iVar10)) {
                memcpy(local_160 + (long)pVVar16[(long)pVVar14].pointer,
                       (void *)(local_120->binding).name.field_2._M_allocated_capacity,
                       (long)(iVar10 * pVVar16[(long)pVVar14].numElements));
              }
              else {
                if (iVar12 == 0) {
                  iVar12 = iVar10;
                }
                if (iVar9 == 0) {
                  iVar9 = iVar10;
                }
                iVar33 = 0;
                iVar27 = 0;
                for (lVar30 = 0; lVar30 < pVVar16[(long)pVVar14].numElements; lVar30 = lVar30 + 1) {
                  memcpy((pointer)((long)pVVar16[(long)pVVar14].pointer + (long)local_160) + iVar33,
                         (void *)((local_120->binding).name.field_2._M_allocated_capacity +
                                 (long)iVar27),(long)iVar10);
                  iVar27 = iVar27 + iVar9;
                  iVar33 = iVar33 + iVar12;
                }
              }
              gl = local_100;
              pVVar14 = (pointer)((long)&(local_e8->binding).type + 1);
            }
            (**(code **)(lVar20 + 0x40))(0x8892,dVar11);
            (**(code **)(lVar20 + 0x150))
                      (0x8892,(long)((int)localBuf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (int)localBuf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                       localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x88e4);
            (**(code **)(lVar20 + 0x40))(0x8892,0);
            dVar11 = (**(code **)(lVar20 + 0x800))();
            __n = "Uploading buffer data failed";
            checkError(dVar11,"Uploading buffer data failed",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
                       ,0x14e);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            uVar23 = local_f8;
          }
          vertexBuffer.m_layout.buffer = vertexBuffer.super_Buffer.super_ObjectWrapper.m_object;
          if ((ulong)((long)vertexBuffer.m_layout.attributes.
                            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                     (long)vertexBuffer.m_layout.attributes.
                           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                           ._M_impl.super__Vector_impl_data._M_start) < uVar23) {
            pVVar19 = std::
                      _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                      ::_M_allocate((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                     *)((long)uVar23 >> 5),(size_t)__n);
            puVar25 = extraout_RDX;
            for (lVar20 = 0; pVVar17 = (pointer)((long)&pVVar16->location + lVar20),
                pVVar17 != pVVar26; lVar20 = lVar20 + 0x20) {
              puVar25 = (undefined8 *)((long)&pVVar19->location + lVar20);
              uVar5 = *(undefined8 *)pVVar17;
              uVar6 = *(undefined8 *)&pVVar17->convert;
              pvVar4 = pVVar17->pointer;
              puVar25[2] = *(undefined8 *)&pVVar17->numElements;
              puVar25[3] = pvVar4;
              *puVar25 = uVar5;
              puVar25[1] = uVar6;
            }
            std::
            _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ::_M_deallocate((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                             *)vertexBuffer.m_layout.attributes.
                               super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                            (pointer)((long)vertexBuffer.m_layout.attributes.
                                            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)vertexBuffer.m_layout.attributes.
                                            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5),
                            (size_t)puVar25);
            vertexBuffer.m_layout.attributes.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)&pVVar19->location + uVar23);
            vertexBuffer.m_layout.attributes.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_start = pVVar19;
          }
          else {
            __n_01 = (long)vertexBuffer.m_layout.attributes.
                           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)vertexBuffer.m_layout.attributes.
                           super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (__n_01 < uVar23) {
              if (vertexBuffer.m_layout.attributes.
                  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  vertexBuffer.m_layout.attributes.
                  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                memmove(vertexBuffer.m_layout.attributes.
                        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                        ._M_impl.super__Vector_impl_data._M_start,pVVar16,__n_01);
                __n_01 = (long)vertexBuffer.m_layout.attributes.
                               super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vertexBuffer.m_layout.attributes.
                               super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                               ._M_impl.super__Vector_impl_data._M_start;
              }
              for (pVVar16 = (pointer)((long)&pVVar16->location + __n_01); pVVar16 != pVVar26;
                  pVVar16 = pVVar16 + 1) {
                iVar12 = pVVar16->location;
                VVar28 = pVVar16->componentType;
                VVar2 = pVVar16->convert;
                iVar10 = pVVar16->numComponents;
                iVar9 = pVVar16->stride;
                pvVar4 = pVVar16->pointer;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->numElements = pVVar16->numElements;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->stride = iVar9;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->pointer = pvVar4;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->location = iVar12;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->componentType = VVar28;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->convert = VVar2;
                (vertexBuffer.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->numComponents = iVar10;
                vertexBuffer.m_layout.attributes.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     vertexBuffer.m_layout.attributes.
                     super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else if (pVVar26 != pVVar16) {
              memmove(vertexBuffer.m_layout.attributes.
                      super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                      ._M_impl.super__Vector_impl_data._M_start,pVVar16,uVar23);
            }
          }
          vertexBuffer.m_layout.attributes.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)&(vertexBuffer.m_layout.attributes.
                                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->location + uVar23);
          std::_Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>::
          ~_Vector_base(&srcPtrs.
                         super__Vector_base<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>
                       );
          std::
          vector<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ::~vector(&local_150);
          (*gl->bindBuffer)(0x8892,vertexBuffer.m_layout.buffer);
          for (pVVar26 = vertexBuffer.m_layout.attributes.
                         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar26 !=
              vertexBuffer.m_layout.attributes.
              super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
              ._M_impl.super__Vector_impl_data._M_finish; pVVar26 = pVVar26 + 1) {
            anon_unknown_4::setVertexAttribPointer(gl,pVVar26);
          }
          (*gl->bindBuffer)(0x8892,0);
          pvVar4 = local_118->indices;
          if (pvVar4 == (void *)0x0) {
            if ((VertexArrayBinding *)callback != (VertexArrayBinding *)0x0) {
              (*(code *)**(undefined8 **)&((VertexArrayBinding *)callback)->binding)();
            }
            anon_unknown_4::drawNonIndexed(gl,local_118->type,local_118->numElements);
            if ((VertexArrayBinding *)callback != (VertexArrayBinding *)0x0) {
              (**(code **)(*(long *)&((VertexArrayBinding *)callback)->binding + 8))();
            }
          }
          else {
            iVar9 = local_118->numElements;
            IVar3 = local_118->indexType;
            TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
                      ((TypedObjectWrapper<(glu::ObjectType)1> *)&localBuf,context);
            iVar12 = (*context->_vptr_RenderContext[3])(context);
            lVar20 = CONCAT44(extraout_var_01,iVar12);
            (**(code **)(lVar20 + 0x40))
                      (0x8893,(ulong)localBuf.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff
                      );
            iVar12 = 0;
            if (IVar3 < INDEXTYPE_LAST) {
              iVar12 = *(int *)(&DAT_00a2ff74 + (ulong)IVar3 * 4);
            }
            (**(code **)(lVar20 + 0x150))(0x8893,(long)(iVar12 * iVar9),pvVar4,0x88e4);
            (**(code **)(lVar20 + 0x40))(0x8893,0);
            dVar11 = (**(code **)(lVar20 + 0x800))();
            checkError(dVar11,"Uploading index data failed",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
                       ,0x17e);
            gl = local_100;
            (*local_100->bindBuffer)
                      (0x8893,(GLuint)localBuf.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if ((VertexArrayBinding *)callback != (VertexArrayBinding *)0x0) {
              (*(code *)**(undefined8 **)&((VertexArrayBinding *)callback)->binding)();
            }
            anon_unknown_4::drawIndexed
                      (gl,local_118->type,local_118->numElements,local_118->indexType,(void *)0x0);
            if ((VertexArrayBinding *)callback != (VertexArrayBinding *)0x0) {
              (**(code **)(*(long *)&((VertexArrayBinding *)callback)->binding + 8))();
            }
            (*gl->bindBuffer)(0x8893,0);
            ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&localBuf);
          }
          anon_unknown_4::VertexBuffer::~VertexBuffer(&vertexBuffer);
          for (pVVar14 = bindingsWithLocations.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pVVar14 !=
              bindingsWithLocations.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_finish; pVVar14 = pVVar14 + 1) {
            (*gl->disableVertexAttribArray)((pVVar14->binding).location);
          }
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                    (&bindingsWithLocations);
          return;
        }
        uVar24 = uVar29 + 3 & 0xfffffffc;
        iVar9 = (pVVar14->binding).location;
        VVar28 = (pVVar14->pointer).componentType;
        uVar1 = (pVVar14->pointer).numComponents;
        iVar12 = (pVVar14->pointer).numElements;
        VVar2 = (pVVar14->pointer).convert;
        pVVar15 = (pointer)(long)(int)uVar24;
        local_160 = (pointer)CONCAT44(local_160._4_4_,uVar1);
        local_120 = pVVar14;
        if (pVVar26 == pVVar19) {
          local_f8 = CONCAT44(local_f8._4_4_,VVar2);
          local_168 = (pointer)CONCAT44(local_168._4_4_,VVar28);
          lVar30 = (long)pVVar19 - (long)pVVar16;
          local_f0 = pVVar15;
          if (lVar30 == 0x7fffffffffffffe0) {
            local_158 = uVar29;
            local_150.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_start = pVVar16;
            local_150.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_finish = pVVar26;
            local_150.
            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar19;
            local_138 = uVar22;
            local_130 = pVVar26;
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          __p = (pointer)(lVar30 >> 5);
          pVVar17 = __p;
          if (pVVar19 == pVVar16) {
            pVVar17 = (pointer)0x1;
          }
          this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  *)((long)&__p->location + (long)&pVVar17->location);
          if ((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
               *)0x3fffffffffffffe < this) {
            this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    *)0x3ffffffffffffff;
          }
          if (CARRY8((ulong)pVVar17,(ulong)__p)) {
            this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    *)0x3ffffffffffffff;
          }
          local_138 = uVar22;
          local_130 = pVVar26;
          local_128 = pVVar16;
          pVVar16 = std::
                    _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    ::_M_allocate(this,(ulong)uVar1);
          *(int *)((long)pVVar16 + lVar30) = iVar9;
          *(VertexComponentType *)((long)pVVar16 + lVar30 + 4) = (VertexComponentType)local_168;
          *(undefined4 *)((long)pVVar16 + lVar30 + 8) = (undefined4)local_f8;
          *(int *)((long)pVVar16 + lVar30 + 0xc) = (int)local_160;
          *(int *)((long)pVVar16 + lVar30 + 0x10) = iVar12;
          *(undefined4 *)((long)pVVar16 + lVar30 + 0x14) = 0;
          *(pointer *)((long)pVVar16 + lVar30 + 0x18) = local_f0;
          pVVar26 = pVVar16;
          for (pVVar17 = local_128; pVVar17 != pVVar19; pVVar17 = pVVar17 + 1) {
            iVar10 = pVVar17->location;
            VVar28 = pVVar17->componentType;
            VVar2 = pVVar17->convert;
            iVar27 = pVVar17->numComponents;
            iVar9 = pVVar17->stride;
            pvVar4 = pVVar17->pointer;
            pVVar26->numElements = pVVar17->numElements;
            pVVar26->stride = iVar9;
            pVVar26->pointer = pvVar4;
            pVVar26->location = iVar10;
            pVVar26->componentType = VVar28;
            pVVar26->convert = VVar2;
            pVVar26->numComponents = iVar27;
            pVVar26 = pVVar26 + 1;
          }
          std::
          _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ::_M_deallocate((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                           *)local_128,__p,__n_00);
          pVVar19 = pVVar16 + (long)this;
          pVVar31 = local_110;
          uVar23 = local_108;
          VVar28 = (VertexComponentType)local_168;
        }
        else {
          pVVar26->location = iVar9;
          pVVar26->componentType = VVar28;
          pVVar26->convert = VVar2;
          pVVar26->numComponents = uVar1;
          pVVar26->numElements = iVar12;
          pVVar26->stride = 0;
          pVVar26->pointer = pVVar15;
        }
        pVVar26 = pVVar26 + 1;
        iVar9 = anon_unknown_4::getVtxCompSize(VVar28);
        uVar29 = iVar12 * (int)local_160 * iVar9 + uVar24;
        pVVar14 = local_120 + 1;
      } while( true );
    }
    if ((pVVar14->binding).type != TYPE_LOCATION) break;
    __k = &(pVVar14->binding).location;
    iVar13 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
             find((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &localBuf,__k);
    if (iVar13._M_node !=
        (_Base_ptr)
        &localBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish) break;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&localBuf
               ,__k);
    pVVar14 = pVVar14 + 1;
    lVar30 = lVar30 + -0x50;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &localBuf);
  pTVar21 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&localBuf,"Invalid vertex array locations",(allocator<char> *)&srcPtrs);
  tcu::TestError::TestError(pTVar21,(string *)&localBuf);
  __cxa_throw(pTVar21,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void drawFromBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Create buffers for duration of draw call.
	{
		VertexBuffer vertexBuffer (context, (int)bindingsWithLocations.size(), (bindingsWithLocations.empty()) ? (DE_NULL) : (&bindingsWithLocations[0]));

		// Set state.
		setVertexBufferAttributes(gl, vertexBuffer.getDescriptor());

		if (primitives.indices)
		{
			IndexBuffer indexBuffer(context, primitives.indexType, primitives.numElements, primitives.indices);

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);

			if (callback)
				callback->beforeDrawCall();

			drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, 0);

			if (callback)
				callback->afterDrawCall();

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else
		{
			if (callback)
				callback->beforeDrawCall();

			drawNonIndexed(gl, primitives.type, primitives.numElements);

			if (callback)
				callback->afterDrawCall();
		}
	}

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		gl.disableVertexAttribArray(vaIter->binding.location);
}